

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O0

int __thiscall CJSON::IsUTF8(CJSON *this,uchar c)

{
  uchar c_local;
  CJSON *this_local;
  
  if ((c & 0xf0) == 0xf0) {
    this_local._4_4_ = 3;
  }
  else if ((c & 0xe0) == 0xe0) {
    this_local._4_4_ = 2;
  }
  else if ((c & 0xc0) == 0xc0) {
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

inline int IsUTF8(unsigned char c)
        {
            if((c & 0xF0) == 0xF0)
                return 3;
            if((c & 0xE0) == 0xE0)
                return 2;
            if((c & 0xC0) == 0xC0)
                return 1;

            return 0;
        }